

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O1

int SharpYuvOptionsInitInternal
              (SharpYuvConversionMatrix *yuv_matrix,SharpYuvOptions *options,int version)

{
  bool bVar1;
  
  bVar1 = (version & 0xffff0000U) == 0x40000;
  if (bVar1 && (yuv_matrix != (SharpYuvConversionMatrix *)0x0 && options != (SharpYuvOptions *)0x0))
  {
    options->yuv_matrix = yuv_matrix;
    options->transfer_type = kSharpYuvTransferFunctionSrgb;
  }
  return (uint)(bVar1 && (yuv_matrix != (SharpYuvConversionMatrix *)0x0 &&
                         options != (SharpYuvOptions *)0x0));
}

Assistant:

int SharpYuvOptionsInitInternal(const SharpYuvConversionMatrix* yuv_matrix,
                                SharpYuvOptions* options, int version) {
  const int major = (version >> 24);
  const int minor = (version >> 16) & 0xff;
  if (options == NULL || yuv_matrix == NULL ||
      (major == SHARPYUV_VERSION_MAJOR && major == 0 &&
       minor != SHARPYUV_VERSION_MINOR) ||
      (major != SHARPYUV_VERSION_MAJOR)) {
    return 0;
  }
  options->yuv_matrix = yuv_matrix;
  options->transfer_type = kSharpYuvTransferFunctionSrgb;
  return 1;
}